

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O3

int ly_utf8_less(char *input,int bytes,...)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte local_b8 [56];
  va_list ap;
  
  pbVar3 = &stack0x00000008;
  if (0 < bytes) {
    uVar1 = 0x10;
    uVar2 = 0;
    do {
      if ((uint)uVar1 < 0x29) {
        pbVar4 = local_b8 + uVar1;
        uVar1 = (ulong)((uint)uVar1 + 8);
      }
      else {
        pbVar4 = pbVar3;
        pbVar3 = pbVar3 + 8;
      }
      if (*pbVar4 < (byte)input[uVar2]) {
        return 0;
      }
      if ((byte)input[uVar2] < *pbVar4) {
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)bytes != uVar2);
  }
  return 0;
}

Assistant:

static int
ly_utf8_less(const char *input, int bytes, ...)
{
    va_list ap;
    int i, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        byte = va_arg(ap, int);

        /* compare until bytes differ */
        if ((uint8_t)input[i] > (uint8_t)byte) {
            return 0;
        } else if ((uint8_t)input[i] < (uint8_t)byte) {
            return 1;
        }
    }
    va_end(ap);

    /* equals */
    return 0;
}